

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Address.cpp
# Opt level: O2

istream * operator>>(istream *in,Address *a)

{
  string street;
  string city;
  string country;
  undefined1 *local_70;
  undefined8 local_68;
  undefined1 local_60 [16];
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [16];
  undefined1 *local_30;
  undefined8 local_28;
  undefined1 local_20 [16];
  
  local_30 = local_20;
  local_28 = 0;
  local_20[0] = 0;
  std::operator>>(in,(string *)&local_30);
  local_50 = local_40;
  local_48 = 0;
  local_40[0] = 0;
  std::operator>>(in,(string *)&local_50);
  local_70 = local_60;
  local_68 = 0;
  local_60[0] = 0;
  std::operator>>(in,(string *)&local_70);
  std::__cxx11::string::_M_assign((string *)a);
  std::__cxx11::string::_M_assign((string *)&a->city);
  std::__cxx11::string::_M_assign((string *)&a->street);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  return in;
}

Assistant:

istream &operator>>(istream &in, Address &a) {
    // take each string line by line or separated by space
    string country;
    in >> country;
    string city;
    in >> city;
    string street;
    in >> street;
    a.country = country;
    a.city = city;
    a.street = street;
    return in;
}